

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

uint64_t __thiscall rcg::Buffer::getPixelFormat(Buffer *this,uint32_t part)

{
  void *pvVar1;
  unsigned_long uVar2;
  uint64_t uVar3;
  
  if (this->multipart == true) {
    pvVar1 = Stream::getHandle(this->parent);
    uVar2 = anon_unknown_6::getBufferPartValue<unsigned_long>
                      (&this->gentl,pvVar1,this->buffer,part,3);
    return uVar2;
  }
  if ((this->payload_type == 4) &&
     ((this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0)) {
    uVar3 = getInteger(&this->nodemap,"ChunkPixelFormat",(int64_t *)0x0,(int64_t *)0x0,true,false);
    return uVar3;
  }
  pvVar1 = Stream::getHandle(this->parent);
  uVar2 = anon_unknown_6::getBufferValue<unsigned_long>(&this->gentl,pvVar1,this->buffer,0x14);
  return uVar2;
}

Assistant:

uint64_t Buffer::getPixelFormat(uint32_t part) const
{
  if (multipart)
  {
    return getBufferPartValue<uint64_t>(gentl, parent->getHandle(), buffer, part,
                                        GenTL::BUFFER_PART_INFO_DATA_FORMAT);
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      try
      {
        return getInteger(nodemap, "ChunkPixelFormat", 0, 0, true);
      }
      catch (const std::exception &)
      {
        // ignore error and try getBufferValue()
      }
    }

    return getBufferValue<uint64_t>(gentl, parent->getHandle(), buffer,
                                    GenTL::BUFFER_INFO_PIXELFORMAT);
  }
}